

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.cpp
# Opt level: O1

vector<skiwi::token,_std::allocator<skiwi::token>_> *
skiwi::tokenize(vector<skiwi::token,_std::allocator<skiwi::token>_> *__return_storage_ptr__,
               string *str)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  char cVar7;
  byte *pbVar8;
  bool bVar9;
  bool is_a_symbol;
  int line_nr;
  int temp_line_nr;
  int temp_column_nr;
  string buff;
  stringstream str_1;
  bool local_259;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  string local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined4 local_208;
  undefined4 uStack_204;
  long local_200;
  long local_1f8 [2];
  e_type local_1e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  byte *local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  pbVar8 = (byte *)(str->_M_dataplus)._M_p;
  local_1c0 = (byte *)str->_M_string_length;
  local_259 = false;
  local_254 = 1;
  local_258 = 1;
  if ((long)local_1c0 < 1) {
LAB_00255841:
    anon_unknown_3::_treat_buffer(&local_248,__return_storage_ptr__,local_254,local_258,&local_259);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                               local_248.field_2._M_local_buf[0]) + 1);
    }
    return __return_storage_ptr__;
  }
  local_1c0 = local_1c0 + (long)pbVar8;
  bVar9 = false;
LAB_00254f98:
  if (((ulong)*pbVar8 < 0x21) && ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0)) {
    anon_unknown_3::_treat_buffer(&local_248,__return_storage_ptr__,local_254,local_258,&local_259);
    iVar2 = local_254;
    do {
      bVar1 = *pbVar8;
      if (bVar1 < 0xd) {
        if (bVar1 != 9) {
          if (bVar1 != 10) goto LAB_00255010;
          iVar2 = iVar2 + 1;
          local_258 = 0;
          local_254 = iVar2;
        }
      }
      else if ((bVar1 != 0xd) && (bVar1 != 0x20)) goto LAB_00255010;
      pbVar8 = pbVar8 + 1;
      local_258 = local_258 + 1;
    } while( true );
  }
  goto LAB_00255012;
LAB_00255010:
  bVar9 = false;
LAB_00255012:
  pbVar5 = pbVar8;
  if (bVar9) goto switchD_0025504b_caseD_24;
  bVar1 = *pbVar8;
  if (0x3a < bVar1) {
    if (bVar1 < 0x5d) {
      if (bVar1 == 0x3b) {
        anon_unknown_3::_treat_buffer
                  (&local_248,__return_storage_ptr__,local_254,local_258,&local_259);
        pbVar6 = pbVar8;
        do {
          pbVar5 = pbVar6 + 1;
          bVar1 = *pbVar6;
          if (bVar1 == 0) break;
          pbVar6 = pbVar5;
        } while (bVar1 != 10);
LAB_002555e0:
        local_254 = local_254 + 1;
        local_258 = 1;
        goto switchD_0025504b_caseD_24;
      }
      if (bVar1 != 0x5b) goto switchD_0025504b_caseD_24;
      anon_unknown_3::_treat_buffer
                (&local_248,__return_storage_ptr__,local_254,local_258,&local_259);
      local_1b8._0_4_ = 7;
      std::vector<skiwi::token,std::allocator<skiwi::token>>::
      emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                 (e_type *)local_1b8,(char (*) [2])"[",&local_254,&local_258);
    }
    else if (bVar1 == 0x5d) {
      anon_unknown_3::_treat_buffer
                (&local_248,__return_storage_ptr__,local_254,local_258,&local_259);
      local_1b8._0_4_ = 8;
      std::vector<skiwi::token,std::allocator<skiwi::token>>::
      emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                 (e_type *)local_1b8,(char (*) [2])0x25ae25,&local_254,&local_258);
    }
    else {
      if (bVar1 != 0x60) goto switchD_0025504b_caseD_24;
      anon_unknown_3::_treat_buffer
                (&local_248,__return_storage_ptr__,local_254,local_258,&local_259);
      local_1b8._0_4_ = 2;
      std::vector<skiwi::token,std::allocator<skiwi::token>>::
      emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                 (e_type *)local_1b8,(char (*) [2])"`",&local_254,&local_258);
    }
    goto LAB_0025567f;
  }
  switch(bVar1) {
  case 0x22:
    anon_unknown_3::_treat_buffer(&local_248,__return_storage_ptr__,local_254,local_258,&local_259);
    local_24c = local_258;
    local_250 = local_254;
    iVar2 = local_254;
    do {
      pbVar6 = pbVar5;
      pbVar5 = pbVar6 + 1;
      local_258 = local_258 + 1;
      bVar1 = pbVar6[1];
      if (bVar1 == 10) {
        iVar2 = iVar2 + 1;
        local_258 = 0;
        local_254 = iVar2;
      }
      else if ((bVar1 == 0) || (bVar1 == 0x22)) goto LAB_0025512c;
    } while ((*pbVar5 != 0x5c) || (pbVar5 = pbVar6 + 2, pbVar6[2] != 0));
    local_208 = 0;
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,pbVar8,pbVar5);
    std::vector<skiwi::token,std::allocator<skiwi::token>>::
    emplace_back<skiwi::token::e_type,std::__cxx11::string,int&,int&>
              ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
               (e_type *)&local_208,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
               &local_250,&local_24c);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
LAB_0025512c:
    if (*pbVar5 != 0) {
      pbVar5 = pbVar5 + 1;
      local_258 = local_258 + 1;
    }
    local_1e4 = T_STRING;
    local_228 = &local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,pbVar8,pbVar5);
    cVar7 = (char)(string *)&local_228;
    lVar3 = std::__cxx11::string::find(cVar7,0x5c);
    if (lVar3 == -1) {
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      if (local_228 == &local_218) {
        local_1e0.field_2._8_8_ = local_218._8_8_;
      }
      else {
        local_1e0._M_dataplus._M_p = (pointer)local_228;
      }
      local_1e0.field_2._M_allocated_capacity._1_7_ = local_218._M_allocated_capacity._1_7_;
      local_1e0.field_2._M_local_buf[0] = local_218._M_local_buf[0];
      local_1e0._M_string_length = local_220;
      local_220 = 0;
      local_218._M_local_buf[0] = '\0';
      local_228 = &local_218;
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      do {
        std::__cxx11::string::substr((ulong)&local_208,(ulong)&local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),(char *)CONCAT44(uStack_204,local_208),local_200);
        if ((long *)CONCAT44(uStack_204,local_208) != local_1f8) {
          operator_delete((long *)CONCAT44(uStack_204,local_208),local_1f8[0] + 1);
        }
        bVar1 = local_228->_M_local_buf[lVar3 + 1];
        if (bVar1 < 0x6e) {
          if (bVar1 == 0x61) {
            local_208 = CONCAT31(local_208._1_3_,7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b8 + 0x10),(char *)&local_208,1);
          }
          else if (bVar1 == 0x62) {
            local_208 = CONCAT31(local_208._1_3_,8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b8 + 0x10),(char *)&local_208,1);
          }
          else {
LAB_00255286:
            local_208 = CONCAT31(local_208._1_3_,bVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b8 + 0x10),(char *)&local_208,1);
          }
        }
        else if (bVar1 == 0x6e) {
          local_208 = CONCAT31(local_208._1_3_,10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),(char *)&local_208,1);
        }
        else if (bVar1 == 0x72) {
          local_208 = CONCAT31(local_208._1_3_,0xd);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),(char *)&local_208,1);
        }
        else {
          if (bVar1 != 0x74) goto LAB_00255286;
          local_208 = CONCAT31(local_208._1_3_,9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),(char *)&local_208,1);
        }
        std::__cxx11::string::substr((ulong)&local_208,(ulong)&local_228);
        std::__cxx11::string::operator=((string *)&local_228,(string *)&local_208);
        if ((long *)CONCAT44(uStack_204,local_208) != local_1f8) {
          operator_delete((long *)CONCAT44(uStack_204,local_208),local_1f8[0] + 1);
        }
        lVar3 = std::__cxx11::string::find(cVar7,0x5c);
      } while (lVar3 != -1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),local_228->_M_local_buf,local_220);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    std::vector<skiwi::token,std::allocator<skiwi::token>>::
    emplace_back<skiwi::token::e_type,std::__cxx11::string,int&,int&>
              ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
               &local_1e4,&local_1e0,&local_250,&local_24c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,
                      CONCAT71(local_218._M_allocated_capacity._1_7_,local_218._M_local_buf[0]) + 1)
      ;
    }
    goto switchD_0025504b_caseD_24;
  case 0x23:
    if (local_259 != false) goto switchD_0025504b_caseD_24;
    anon_unknown_3::_treat_buffer(&local_248,__return_storage_ptr__,local_254,local_258,&local_259);
    if (pbVar8[1] == 0x7c) {
      iVar4 = local_258 + 1;
      bVar9 = false;
      pbVar6 = pbVar8 + 2;
      iVar2 = local_254;
      local_258 = iVar4;
      do {
        while( true ) {
          pbVar5 = pbVar6 + 1;
          bVar1 = *pbVar6;
          if (bVar1 != 10) break;
          iVar2 = iVar2 + 1;
          iVar4 = 0;
          local_254 = iVar2;
LAB_0025578b:
          iVar4 = iVar4 + 1;
          pbVar6 = pbVar5;
          local_258 = iVar4;
        }
        if (bVar1 == 0) {
          bVar9 = true;
          pbVar5 = pbVar6;
        }
        else {
          if (bVar1 != 0x7c) goto LAB_0025578b;
          if (*pbVar5 == 0x23) {
            bVar9 = true;
          }
        }
        pbVar6 = pbVar5;
      } while (!bVar9);
      goto LAB_0025579d;
    }
    pbVar5 = pbVar8 + 1;
    if (pbVar8[1] == 0x3b) {
      for (; (pbVar5[-1] != 0 && (pbVar5[-1] != 10)); pbVar5 = pbVar5 + 1) {
      }
      goto LAB_002555e0;
    }
    local_259 = true;
    goto LAB_00255683;
  default:
    goto switchD_0025504b_caseD_24;
  case 0x27:
    anon_unknown_3::_treat_buffer(&local_248,__return_storage_ptr__,local_254,local_258,&local_259);
    local_1b8._0_4_ = 1;
    std::vector<skiwi::token,std::allocator<skiwi::token>>::
    emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
              ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
               (e_type *)local_1b8,(char (*) [2])"\'",&local_254,&local_258);
    break;
  case 0x28:
    if ((local_259 == true) && (local_248._M_string_length == 0)) {
      local_259 = false;
      local_1b8._0_4_ = 5;
      std::vector<skiwi::token,std::allocator<skiwi::token>>::
      emplace_back<skiwi::token::e_type,char_const(&)[3],int&,int&>
                ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                 (e_type *)local_1b8,(char (*) [3])"#(",&local_254,&local_258);
    }
    else {
      anon_unknown_3::_treat_buffer
                (&local_248,__return_storage_ptr__,local_254,local_258,&local_259);
      local_1b8._0_4_ = 5;
      std::vector<skiwi::token,std::allocator<skiwi::token>>::
      emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                 (e_type *)local_1b8,(char (*) [2])0x25d455,&local_254,&local_258);
    }
    break;
  case 0x29:
    anon_unknown_3::_treat_buffer(&local_248,__return_storage_ptr__,local_254,local_258,&local_259);
    local_1b8._0_4_ = 6;
    std::vector<skiwi::token,std::allocator<skiwi::token>>::
    emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
              ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
               (e_type *)local_1b8,(char (*) [2])0x25b381,&local_254,&local_258);
    break;
  case 0x2c:
    anon_unknown_3::_treat_buffer(&local_248,__return_storage_ptr__,local_254,local_258,&local_259);
    if (pbVar8[1] == 0x40) {
      local_1b8._0_4_ = 4;
      std::vector<skiwi::token,std::allocator<skiwi::token>>::
      emplace_back<skiwi::token::e_type,char_const(&)[3],int&,int&>
                ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                 (e_type *)local_1b8,(char (*) [3])",@",&local_254,&local_258);
      local_258 = local_258 + 1;
      pbVar5 = pbVar8 + 1;
    }
    else {
      local_1b8._0_4_ = 3;
      std::vector<skiwi::token,std::allocator<skiwi::token>>::
      emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                 (e_type *)local_1b8,(char (*) [2])",",&local_254,&local_258);
    }
LAB_0025579d:
    pbVar5 = pbVar5 + 1;
    goto LAB_00255683;
  }
LAB_0025567f:
  pbVar5 = pbVar8 + 1;
LAB_00255683:
  local_258 = local_258 + 1;
switchD_0025504b_caseD_24:
  if (pbVar8 == pbVar5) {
    std::__cxx11::string::push_back((char)&local_248);
    pbVar5 = pbVar5 + 1;
    local_258 = local_258 + 1;
  }
  bVar9 = false;
  if ((local_259 == true) && (local_248._M_string_length == 1)) {
    bVar9 = *local_248._M_dataplus._M_p == '\\';
  }
  pbVar8 = pbVar5;
  if (local_1c0 <= pbVar5) goto LAB_00255841;
  goto LAB_00254f98;
}

Assistant:

std::vector<token> tokenize(const std::string& str)
  {
  std::vector<token> tokens;
  std::string buff;

  const char* s = str.c_str();
  const char* s_end = str.c_str() + str.length();

  bool is_a_symbol = false;
  bool is_a_character = false;

  int line_nr = 1;
  int column_nr = 1;

  while (s < s_end)
    {
    //if (*s == ' ' || *s == '\n')
    if (ignore_character(*s))
      {
      _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
      is_a_character = false;
      //while (*s == ' ' || *s == '\n')
      while (ignore_character(*s))
        {
        if (*s == '\n')
          {
          ++line_nr;
          column_nr = 0;
          }
        ++s;
        ++column_nr;
        }
      }

    const char* s_copy = s;
    if (!is_a_character) // any special sign can appear as a character, e.g. #\(
      {
      switch (*s)
        {
        case '(':
        {
        if (is_a_symbol && buff.empty()) // #(
          {
          is_a_symbol = false;
          tokens.emplace_back(token::T_LEFT_ROUND_BRACKET, "#(", line_nr, column_nr);
          ++s;
          ++column_nr;
          break;
          }
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_LEFT_ROUND_BRACKET, "(", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case ')':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_RIGHT_ROUND_BRACKET, ")", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case '[':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_LEFT_SQUARE_BRACKET, "[", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case ']':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_RIGHT_SQUARE_BRACKET, "]", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case '#':
        {
        if (is_a_symbol)
          break;
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        const char* t = s;
        ++t;
        if (t && *t == ';') //treat as comment
          {
          while (*s && *s != '\n') // comment, so skip till end of the line
            ++s;
          ++s;
          ++line_nr;
          column_nr = 1;
          }
        else if (t && *t == '|') //treat as multiline comment
          {
          s = t;
          ++s; ++column_nr;
          bool end_of_comment_found = false;
          while (!end_of_comment_found)
            {
            while (*s && *s != '|')
              {
              if (*s == '\n')
                {
                ++line_nr;
                column_nr = 0;
                }
              ++s;
              ++column_nr;
              }
            if (!(*s) || (*(++s) == '#'))
              end_of_comment_found = true;
            }
          ++s; ++column_nr;
          }
        else
          {
          is_a_symbol = true;
          ++s;
          ++column_nr;
          }
        break;
        }
        case ';':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        while (*s && *s != '\n') // comment, so skip till end of the line
          ++s;
        ++s;
        ++line_nr;
        column_nr = 1;
        break;
        }
        case '\'':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_QUOTE, "'", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case '`':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_BACKQUOTE, "`", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case ',':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        const char* t = s;
        ++t;
        if (*t && *t == '@')
          {
          tokens.emplace_back(token::T_UNQUOTE_SPLICING, ",@", line_nr, column_nr);
          ++s;
          ++column_nr;
          }
        else
          {
          tokens.emplace_back(token::T_UNQUOTE, ",", line_nr, column_nr);
          }
        ++s;
        ++column_nr;
        break;
        }
        case '"':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        int temp_column_nr = column_nr;
        int temp_line_nr = line_nr;
        const char* t = s;
        ++t;
        ++column_nr;
        while (*t && *t != '"')
          {
          if (*t == '\n')
            {
            ++line_nr;
            column_nr = 0;
            }
          if (*t == '\\') // escape syntax
            {
            ++t;
            if (!*t)
              {
              tokens.emplace_back(token::T_BAD, std::string(s, t), temp_line_nr, temp_column_nr);
              break;
              }
            }
          ++t;
          ++column_nr;
          }
        if (*t)
          {
          ++t;
          ++column_nr;
          }
        tokens.emplace_back(token::T_STRING, replace_escape_chars(std::string(s, t)), temp_line_nr, temp_column_nr);
        s = t;
        break;
        }
        }
      }

    if (s_copy == s)
      {
      buff += *s;
      ++s;
      ++column_nr;
      }

    is_a_character = (is_a_symbol && buff.size() == 1 && buff[0] == '\\');
    }

  _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);

  return tokens;
  }